

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

_Bool unshield_file_save_raw(Unshield *unshield,int index,char *filename)

{
  _Bool _Var1;
  void *__ptr;
  void *buffer;
  FileDescriptor *file_descriptor_00;
  uint64_t uVar2;
  ulong size;
  size_t sVar3;
  uint local_64;
  uLong bytes_to_write;
  FileDescriptor *file_descriptor;
  UnshieldReader *reader;
  uint bytes_left;
  uchar *output_buffer;
  uchar *input_buffer;
  FILE *output;
  _Bool success;
  char *filename_local;
  int index_local;
  Unshield *unshield_local;
  
  output._7_1_ = false;
  input_buffer = (uchar *)0x0;
  __ptr = malloc(0x10000);
  buffer = malloc(0x10000);
  file_descriptor = (FileDescriptor *)0x0;
  if (unshield != (Unshield *)0x0) {
    file_descriptor_00 = unshield_get_file_descriptor(unshield,index);
    if (file_descriptor_00 == (FileDescriptor *)0x0) {
      _unshield_log(1,"unshield_file_save_raw",0x3cb,"Failed to get file descriptor for file %i",
                    (ulong)(uint)index);
    }
    else if (((file_descriptor_00->flags & 8) == 0) && (file_descriptor_00->data_offset != 0)) {
      if ((file_descriptor_00->link_flags & 1) == 0) {
        file_descriptor =
             (FileDescriptor *)unshield_reader_create(unshield,index,file_descriptor_00);
        if ((UnshieldReader *)file_descriptor == (UnshieldReader *)0x0) {
          _unshield_log(1,"unshield_file_save_raw",0x3de,"Failed to create data reader for file %i",
                        (ulong)(uint)index);
        }
        else {
          uVar2 = unshield_fsize(unshield,((UnshieldReader *)file_descriptor)->volume_file);
          if (uVar2 == file_descriptor_00->data_offset) {
            _unshield_log(1,"unshield_file_save_raw",0x3e4,"File %i is not inside the cabinet.",
                          (ulong)(uint)index);
          }
          else if ((filename == (char *)0x0) ||
                  (input_buffer = (uchar *)unshield_fopen(unshield,filename,"wb"),
                  input_buffer != (uchar *)0x0)) {
            if ((file_descriptor_00->flags & 4) == 0) {
              reader._4_4_ = (uint)file_descriptor_00->expanded_size;
            }
            else {
              reader._4_4_ = (uint)file_descriptor_00->compressed_size;
            }
            do {
              if (reader._4_4_ == 0) {
                output._7_1_ = true;
                goto LAB_001042a3;
              }
              if (reader._4_4_ < 0x10000) {
                local_64 = reader._4_4_;
              }
              else {
                local_64 = 0x10000;
              }
              size = (ulong)local_64;
              _Var1 = unshield_reader_read((UnshieldReader *)file_descriptor,buffer,size);
              if (!_Var1) {
                _unshield_log(1,"unshield_file_save_raw",0x401,
                              "Failed to read %i bytes from input cabinet file %i",size,
                              (ulong)file_descriptor_00->volume);
                goto LAB_001042a3;
              }
              reader._4_4_ = reader._4_4_ - local_64;
            } while ((input_buffer == (uchar *)0x0) ||
                    (sVar3 = unshield_fwrite(unshield,buffer,1,size,input_buffer), size == sVar3));
            _unshield_log(1,"unshield_file_save_raw",0x40a,"Failed to write %i bytes to file \'%s\'"
                          ,size,filename);
          }
          else {
            _unshield_log(1,"unshield_file_save_raw",0x3ed,"Failed to open output file \'%s\'",
                          filename);
          }
        }
      }
      else {
        output._7_1_ = unshield_file_save_raw(unshield,file_descriptor_00->link_previous,filename);
      }
    }
  }
LAB_001042a3:
  unshield_reader_destroy((UnshieldReader *)file_descriptor);
  if (input_buffer != (uchar *)0x0) {
    unshield_fclose(unshield,input_buffer);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (buffer != (void *)0x0) {
    free(buffer);
  }
  return output._7_1_;
}

Assistant:

bool unshield_file_save_raw(Unshield* unshield, int index, const char* filename)
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_raw(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
    unshield_error("File %i is not inside the cabinet.", index);
    goto exit;
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

  if (file_descriptor->flags & FILE_COMPRESSED)
    bytes_left = file_descriptor->compressed_size;
  else
    bytes_left = file_descriptor->expanded_size;

  /*unshield_trace("Bytes to read: %i", bytes_left);*/

  while (bytes_left > 0)
  {
    uLong bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

    if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
    {
#if VERBOSE
      unshield_error("Failed to read %i bytes from input cabinet file %i", 
          bytes_to_write, file_descriptor->volume);
#endif
      goto exit;
    }

    bytes_left -= bytes_to_write;

      if (output) {
          if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
              unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
              goto exit;
          }
      }
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}